

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseParenthesisedExpression(StructuralParser *this)

{
  size_t sVar1;
  bool bVar2;
  CommaSeparatedList *expression;
  Expression *pEVar3;
  CommaSeparatedList *pCVar4;
  ulong uVar5;
  Context *args;
  CompileMessage CStack_68;
  
  expression = (CommaSeparatedList *)parseExpression(this,false);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  if (bVar2) {
    pEVar3 = parseSuffixes(this,(Expression *)expression);
    return pEVar3;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fab);
  if (bVar2) {
    args = &(expression->super_Expression).super_Statement.super_ASTObject.context;
    pCVar4 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                       (&this->allocator->pool,args);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&pCVar4->items,(pCVar4->items).numActive + 1);
    sVar1 = (pCVar4->items).numActive;
    (pCVar4->items).items[sVar1].object = (Expression *)expression;
    (pCVar4->items).numActive = sVar1 + 1;
    do {
      pEVar3 = parseExpression(this,false);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (&pCVar4->items,(pCVar4->items).numActive + 1);
      sVar1 = (pCVar4->items).numActive;
      (pCVar4->items).items[sVar1].object = pEVar3;
      uVar5 = sVar1 + 1;
      (pCVar4->items).numActive = uVar5;
      if (0x10000 < uVar5) {
        CompileMessageHelpers::createMessage<>
                  (&CStack_68,syntax,error,"Initialiser list exceeds max length limit");
        AST::Context::throwError(args,&CStack_68,false);
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fab);
    } while (bVar2);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
    expression = pCVar4;
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  }
  return &expression->super_Expression;
}

Assistant:

AST::Expression& parseParenthesisedExpression()
    {
        auto& e = parseExpression();

        if (matchIf (Operator::closeParen))
            return parseSuffixes (e);

        if (matchIf (Operator::comma))
        {
            auto& list = allocate<AST::CommaSeparatedList> (e.context);
            list.items.push_back (e);

            for (;;)
            {
                list.items.push_back (parseExpression());

                if (list.items.size() > AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::closeParen);
                break;
            }

            return list;
        }

        expect (Operator::closeParen);
        return e;
    }